

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * CompileVmDereference(ExpressionContext *ctx,VmModule *module,ExprDereference *node)

{
  VmValue *pVVar1;
  TypeRef *pTVar2;
  TypeRef *refType;
  VmValue *value;
  ExprDereference *node_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  pVVar1 = CompileVm(ctx,module,node->value);
  pTVar2 = getType<TypeRef>(node->value->type);
  if (pTVar2 == (TypeRef *)0x0) {
    __assert_fail("refType",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xbdd,
                  "VmValue *CompileVmDereference(ExpressionContext &, VmModule *, ExprDereference *)"
                 );
  }
  if (pTVar2->subType == (node->super_ExprBase).type) {
    pVVar1 = anon_unknown.dwarf_1a3010::CreateLoad
                       (ctx,module,(node->super_ExprBase).source,(node->super_ExprBase).type,pVVar1,
                        0);
    pVVar1 = anon_unknown.dwarf_1a3010::CheckType(ctx,&node->super_ExprBase,pVVar1);
    return pVVar1;
  }
  __assert_fail("refType->subType == node->type",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0xbde,
                "VmValue *CompileVmDereference(ExpressionContext &, VmModule *, ExprDereference *)")
  ;
}

Assistant:

VmValue* CompileVmDereference(ExpressionContext &ctx, VmModule *module, ExprDereference *node)
{
	VmValue *value = CompileVm(ctx, module, node->value);

	TypeRef *refType = getType<TypeRef>(node->value->type);

	(void)refType;
	assert(refType);
	assert(refType->subType == node->type);

	return CheckType(ctx, node, CreateLoad(ctx, module, node->source, node->type, value, 0));
}